

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.h
# Opt level: O2

void __thiscall Quadratic::Quadratic(Quadratic *this,HighsLp *lp_,ICrashOptions *options_)

{
  HighsLp::HighsLp(&this->lp,lp_);
  ICrashOptions::ICrashOptions(&this->options,options_);
  *(undefined8 *)
   ((long)&(this->details).
           super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->details).
           super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->details).
  super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->details).
  super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  memset(&(this->xk).col_value,0,0xb0);
  return;
}

Assistant:

Quadratic(HighsLp lp_, ICrashOptions options_)
      : lp(lp_),
        options(options_),
        lp_objective(0.0),
        quadratic_objective(0.0),
        residual_norm_2(0.0),
        mu(0.0) {}